

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_schnorrsig_sign
              (secp256k1_context *ctx,uchar *sig64,uchar *msg32,secp256k1_keypair *keypair,
              secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar34;
  int iVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  code *pcVar55;
  secp256k1_scalar sk;
  secp256k1_scalar k;
  uchar seckey [32];
  uchar buf [32];
  uchar pk_buf [32];
  secp256k1_scalar e;
  secp256k1_ge r;
  uint64_t l [8];
  secp256k1_ge pk;
  secp256k1_gej rj;
  secp256k1_scalar local_268;
  secp256k1_scalar local_248;
  uchar local_228 [32];
  uchar local_208 [72];
  secp256k1_scalar local_1c0;
  secp256k1_ge local_1a0;
  uint64_t local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  undefined1 local_118 [16];
  secp256k1_ge local_108;
  secp256k1_gej local_b0;
  
  local_208[0x10] = '\0';
  local_208[0x11] = '\0';
  local_208[0x12] = '\0';
  local_208[0x13] = '\0';
  local_208[0x14] = '\0';
  local_208[0x15] = '\0';
  local_208[0x16] = '\0';
  local_208[0x17] = '\0';
  local_208[0x18] = '\0';
  local_208[0x19] = '\0';
  local_208[0x1a] = '\0';
  local_208[0x1b] = '\0';
  local_208[0x1c] = '\0';
  local_208[0x1d] = '\0';
  local_208[0x1e] = '\0';
  local_208[0x1f] = '\0';
  local_208[0] = '\0';
  local_208[1] = '\0';
  local_208[2] = '\0';
  local_208[3] = '\0';
  local_208[4] = '\0';
  local_208[5] = '\0';
  local_208[6] = '\0';
  local_208[7] = '\0';
  local_208[8] = '\0';
  local_208[9] = '\0';
  local_208[10] = '\0';
  local_208[0xb] = '\0';
  local_208[0xc] = '\0';
  local_208[0xd] = '\0';
  local_208[0xe] = '\0';
  local_208[0xf] = '\0';
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_schnorrsig_sign_cold_4();
  }
  else if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_cold_3();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_cold_2();
  }
  else {
    if (keypair != (secp256k1_keypair *)0x0) {
      pcVar55 = nonce_function_bip340;
      if (noncefp != (secp256k1_nonce_function_hardened)0x0) {
        pcVar55 = noncefp;
      }
      uVar34 = secp256k1_keypair_load(ctx,&local_268,&local_108,keypair);
      if (((byte)local_108.y.n[0] & 1) != 0) {
        secp256k1_scalar_negate(&local_268,&local_268);
      }
      secp256k1_scalar_get_b32(local_228,&local_268);
      secp256k1_fe_get_b32(local_208 + 0x20,&local_108.x);
      iVar35 = (*pcVar55)(local_208,msg32,local_228,local_208 + 0x20,"BIP0340/nonce",ndata);
      secp256k1_scalar_set_b32(&local_248,local_208,(int *)0x0);
      if (iVar35 == 0) {
        uVar34 = 0;
      }
      if (((local_248.d[1] == 0 && local_248.d[0] == 0) && local_248.d[2] == 0) &&
          local_248.d[3] == 0) {
        uVar34 = 0;
      }
      uVar43 = uVar34 ^ 1;
      uVar36 = (ulong)uVar43 - 1;
      local_248.d[0] = local_248.d[0] & uVar36 | (ulong)uVar43;
      local_248.d[1] = local_248.d[1] & uVar36;
      local_248.d[2] = local_248.d[2] & uVar36;
      local_248.d[3] = uVar36 & local_248.d[3];
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_b0,&local_248);
      secp256k1_ge_set_gej(&local_1a0,&local_b0);
      secp256k1_fe_normalize_var(&local_1a0.y);
      if (((byte)local_1a0.y.n[0] & 1) != 0) {
        secp256k1_scalar_negate(&local_248,&local_248);
      }
      secp256k1_fe_normalize_var(&local_1a0.x);
      secp256k1_fe_get_b32(sig64,&local_1a0.x);
      secp256k1_schnorrsig_challenge(&local_1c0,sig64,msg32,local_208 + 0x20);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_1c0.d[0];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_268.d[0];
      uVar38 = SUB168(auVar1 * auVar17,8);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar38;
      local_148 = SUB168(auVar1 * auVar17,0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_1c0.d[0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_268.d[1];
      auVar2 = auVar2 * auVar18;
      uVar44 = SUB168(auVar2 + auVar33,0);
      uVar49 = SUB168(auVar2 + auVar33,8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_1c0.d[1];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_268.d[0];
      uVar39 = SUB168(auVar3 * auVar19,8);
      uVar36 = SUB168(auVar3 * auVar19,0);
      local_140 = uVar44 + uVar36;
      uVar36 = (ulong)CARRY8(uVar44,uVar36);
      uVar44 = uVar49 + uVar39;
      uVar50 = uVar44 + uVar36;
      uVar51 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar38,auVar2._0_8_)) +
               (ulong)(CARRY8(uVar49,uVar39) || CARRY8(uVar44,uVar36));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_1c0.d[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_268.d[2];
      uVar40 = SUB168(auVar4 * auVar20,8);
      uVar36 = SUB168(auVar4 * auVar20,0);
      uVar38 = uVar50 + uVar36;
      uVar36 = (ulong)CARRY8(uVar50,uVar36);
      uVar39 = uVar51 + uVar40;
      uVar52 = uVar39 + uVar36;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_1c0.d[1];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_268.d[1];
      uVar41 = SUB168(auVar5 * auVar21,8);
      uVar44 = SUB168(auVar5 * auVar21,0);
      uVar50 = uVar38 + uVar44;
      uVar44 = (ulong)CARRY8(uVar38,uVar44);
      uVar49 = uVar52 + uVar41;
      uVar53 = uVar49 + uVar44;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1c0.d[2];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_268.d[0];
      uVar42 = SUB168(auVar6 * auVar22,8);
      uVar38 = SUB168(auVar6 * auVar22,0);
      local_138 = uVar50 + uVar38;
      uVar38 = (ulong)CARRY8(uVar50,uVar38);
      uVar50 = uVar53 + uVar42;
      uVar54 = uVar50 + uVar38;
      uVar45 = (ulong)(CARRY8(uVar51,uVar40) || CARRY8(uVar39,uVar36)) +
               (ulong)(CARRY8(uVar52,uVar41) || CARRY8(uVar49,uVar44)) +
               (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar50,uVar38));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1c0.d[0];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_268.d[3];
      uVar42 = SUB168(auVar7 * auVar23,8);
      uVar36 = SUB168(auVar7 * auVar23,0);
      uVar38 = uVar54 + uVar36;
      uVar36 = (ulong)CARRY8(uVar54,uVar36);
      uVar49 = uVar45 + uVar42;
      uVar54 = uVar49 + uVar36;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1c0.d[1];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_268.d[2];
      uVar51 = SUB168(auVar8 * auVar24,8);
      uVar44 = SUB168(auVar8 * auVar24,0);
      uVar39 = uVar38 + uVar44;
      uVar44 = (ulong)CARRY8(uVar38,uVar44);
      uVar50 = uVar54 + uVar51;
      uVar46 = uVar50 + uVar44;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_1c0.d[2];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_268.d[1];
      uVar52 = SUB168(auVar9 * auVar25,8);
      uVar38 = SUB168(auVar9 * auVar25,0);
      uVar41 = uVar39 + uVar38;
      uVar38 = (ulong)CARRY8(uVar39,uVar38);
      uVar40 = uVar46 + uVar52;
      uVar47 = uVar40 + uVar38;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_1c0.d[3];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_268.d[0];
      uVar53 = SUB168(auVar10 * auVar26,8);
      uVar39 = SUB168(auVar10 * auVar26,0);
      local_130 = uVar41 + uVar39;
      uVar39 = (ulong)CARRY8(uVar41,uVar39);
      uVar41 = uVar47 + uVar53;
      uVar48 = uVar41 + uVar39;
      uVar51 = (ulong)(CARRY8(uVar45,uVar42) || CARRY8(uVar49,uVar36)) +
               (ulong)(CARRY8(uVar54,uVar51) || CARRY8(uVar50,uVar44)) +
               (ulong)(CARRY8(uVar46,uVar52) || CARRY8(uVar40,uVar38)) +
               (ulong)(CARRY8(uVar47,uVar53) || CARRY8(uVar41,uVar39));
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_1c0.d[1];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_268.d[3];
      uVar40 = SUB168(auVar11 * auVar27,8);
      uVar36 = SUB168(auVar11 * auVar27,0);
      uVar38 = uVar48 + uVar36;
      uVar36 = (ulong)CARRY8(uVar48,uVar36);
      uVar39 = uVar51 + uVar40;
      uVar52 = uVar39 + uVar36;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_1c0.d[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_268.d[2];
      uVar41 = SUB168(auVar12 * auVar28,8);
      uVar44 = SUB168(auVar12 * auVar28,0);
      uVar50 = uVar38 + uVar44;
      uVar44 = (ulong)CARRY8(uVar38,uVar44);
      uVar49 = uVar52 + uVar41;
      uVar53 = uVar49 + uVar44;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_1c0.d[3];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_268.d[1];
      uVar42 = SUB168(auVar13 * auVar29,8);
      uVar38 = SUB168(auVar13 * auVar29,0);
      local_128 = uVar50 + uVar38;
      uVar38 = (ulong)CARRY8(uVar50,uVar38);
      uVar50 = uVar53 + uVar42;
      uVar45 = uVar50 + uVar38;
      uVar40 = (ulong)(CARRY8(uVar51,uVar40) || CARRY8(uVar39,uVar36)) +
               (ulong)(CARRY8(uVar52,uVar41) || CARRY8(uVar49,uVar44)) +
               (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar50,uVar38));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_1c0.d[2];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_268.d[3];
      uVar49 = SUB168(auVar14 * auVar30,8);
      uVar36 = SUB168(auVar14 * auVar30,0);
      uVar39 = uVar45 + uVar36;
      uVar36 = (ulong)CARRY8(uVar45,uVar36);
      uVar38 = uVar40 + uVar49;
      uVar41 = uVar38 + uVar36;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_1c0.d[3];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_268.d[2];
      uVar50 = SUB168(auVar15 * auVar31,8);
      uVar44 = SUB168(auVar15 * auVar31,0);
      local_120 = uVar39 + uVar44;
      uVar44 = (ulong)CARRY8(uVar39,uVar44);
      uVar39 = uVar41 + uVar50;
      local_118._8_8_ =
           (ulong)(CARRY8(uVar40,uVar49) || CARRY8(uVar38,uVar36)) +
           (ulong)(CARRY8(uVar41,uVar50) || CARRY8(uVar39,uVar44));
      local_118._0_8_ = uVar39 + uVar44;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_1c0.d[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_268.d[3];
      local_118 = auVar16 * auVar32 + local_118;
      secp256k1_scalar_reduce_512(&local_1c0,&local_148);
      secp256k1_scalar_add(&local_1c0,&local_1c0,&local_248);
      secp256k1_scalar_get_b32(sig64 + 0x20,&local_1c0);
      lVar37 = 0;
      do {
        sig64[lVar37] = sig64[lVar37] & (char)uVar43 - 1U;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 0x40);
      return uVar34;
    }
    secp256k1_schnorrsig_sign_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_schnorrsig_sign(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg32, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg32, seckey, pk_buf, bip340_algo16, ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg32, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    memset(seckey, 0, sizeof(seckey));

    return ret;
}